

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgtweak.c
# Opt level: O3

void pParamAll(int sel)

{
  long lVar1;
  short attr;
  long lVar2;
  
  lVar2 = 0;
  do {
    if ((ulong)(uint)sel * 0x30 == lVar2) {
      attr = 0x200;
      lVar1 = (ulong)(uint)sel * 0x30;
    }
    else {
      attr = 0x100;
      lVar1 = lVar2;
    }
    pParam((Param_s *)(&Param[0].row + lVar1),attr,' ',' ');
    lVar2 = lVar2 + 0x30;
  } while (lVar2 != 0x180);
  return;
}

Assistant:

void pParamAll( int sel)
{
	uint	ii;

	// display all settings

	for (ii = 0; ii < sizeof( Param) / sizeof( *Param); ii++)
	{
		if (sel == ii)
			pParam( Param + ii, ATTR_SEL, ' ', ' ');

		else
			pParam( Param + ii, ATTR_DEF, ' ', ' ');
	}
}